

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::Model(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  ModelDescription *from_00;
  ModelDescription *this_00;
  GLMClassifier *this_01;
  OneHotEncoder *this_02;
  GLMRegressor *this_03;
  TextClassifier *this_04;
  ItemSimilarityRecommender *this_05;
  Pipeline *this_06;
  SerializedModel *this_07;
  LinkedModel *this_08;
  NonMaximumSuppression *this_09;
  ArrayFeatureExtractor *this_10;
  CategoricalMapping *this_11;
  Scaler *this_12;
  Imputer *this_13;
  FeatureVectorizer *this_14;
  DictVectorizer *this_15;
  Normalizer *this_16;
  BayesianProbitRegressor *this_17;
  KNearestNeighborsClassifier *this_18;
  NeuralNetwork *this_19;
  CustomModel *this_20;
  TreeEnsembleRegressor *this_21;
  TreeEnsembleClassifier *this_22;
  NeuralNetworkRegressor *this_23;
  PipelineRegressor *this_24;
  NeuralNetworkClassifier *this_25;
  SupportVectorRegressor *this_26;
  PipelineClassifier *this_27;
  SupportVectorClassifier *this_28;
  Identity *this_29;
  Gazetteer *this_30;
  VisionFeaturePrint *this_31;
  SoundAnalysisPreprocessing *this_32;
  WordTagger *this_33;
  WordEmbedding *this_34;
  NonMaximumSuppression *from_01;
  ArrayFeatureExtractor *from_02;
  CategoricalMapping *from_03;
  Scaler *from_04;
  Imputer *from_05;
  FeatureVectorizer *from_06;
  OneHotEncoder *from_07;
  DictVectorizer *from_08;
  Normalizer *from_09;
  BayesianProbitRegressor *from_10;
  KNearestNeighborsClassifier *from_11;
  NeuralNetwork *from_12;
  CustomModel *from_13;
  ItemSimilarityRecommender *from_14;
  LinkedModel *from_15;
  TreeEnsembleRegressor *from_16;
  TreeEnsembleClassifier *from_17;
  NeuralNetworkRegressor *from_18;
  NeuralNetworkClassifier *from_19;
  GLMRegressor *from_20;
  SupportVectorRegressor *from_21;
  GLMClassifier *from_22;
  SupportVectorClassifier *from_23;
  Identity *from_24;
  Gazetteer *from_25;
  VisionFeaturePrint *from_26;
  SoundAnalysisPreprocessing *from_27;
  TextClassifier *from_28;
  WordTagger *from_29;
  WordEmbedding *from_30;
  Pipeline *from_31;
  PipelineRegressor *from_32;
  PipelineClassifier *from_33;
  SerializedModel *from_34;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Model_003d13a8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->description_;
  if (from_00 == (ModelDescription *)0x0 || from == (Model *)&_Model_default_instance_) {
    this_00 = (ModelDescription *)0x0;
  }
  else {
    this_00 = (ModelDescription *)operator_new(0x78);
    ModelDescription::ModelDescription(this_00,from_00);
  }
  this->description_ = this_00;
  this->specificationversion_ = from->specificationversion_;
  this->isupdatable_ = from->isupdatable_;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if ((int)uVar1 < 400) {
      if ((int)uVar1 < 300) {
        if (uVar1 == 200) {
          clear_Type(this);
          this->_oneof_case_[0] = 200;
          this_27 = (PipelineClassifier *)operator_new(0x20);
          PipelineClassifier::PipelineClassifier(this_27);
          (this->Type_).pipelineclassifier_ = this_27;
          if (from->_oneof_case_[0] == 200) {
            from_33 = (from->Type_).pipelineclassifier_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_33 = (PipelineClassifier *)&_PipelineClassifier_default_instance_;
          }
          PipelineClassifier::MergeFrom(this_27,from_33);
        }
        else if (uVar1 == 0xc9) {
          clear_Type(this);
          this->_oneof_case_[0] = 0xc9;
          this_24 = (PipelineRegressor *)operator_new(0x20);
          PipelineRegressor::PipelineRegressor(this_24);
          (this->Type_).pipelineregressor_ = this_24;
          if (from->_oneof_case_[0] == 0xc9) {
            from_32 = (from->Type_).pipelineregressor_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_32 = (PipelineRegressor *)&_PipelineRegressor_default_instance_;
          }
          PipelineRegressor::MergeFrom(this_24,from_32);
        }
        else if (uVar1 == 0xca) {
          clear_Type(this);
          this->_oneof_case_[0] = 0xca;
          this_06 = (Pipeline *)operator_new(0x48);
          Pipeline::Pipeline(this_06);
          (this->Type_).pipeline_ = this_06;
          if (from->_oneof_case_[0] == 0xca) {
            from_31 = (from->Type_).pipeline_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_31 = (Pipeline *)&_Pipeline_default_instance_;
          }
          Pipeline::MergeFrom(this_06,from_31);
        }
      }
      else {
        switch(uVar1) {
        case 300:
          clear_Type(this);
          this->_oneof_case_[0] = 300;
          this_03 = (GLMRegressor *)operator_new(0x48);
          GLMRegressor::GLMRegressor(this_03);
          (this->Type_).glmregressor_ = this_03;
          if (from->_oneof_case_[0] == 300) {
            from_20 = (from->Type_).glmregressor_;
          }
          else {
            from_20 = GLMRegressor::default_instance();
          }
          GLMRegressor::MergeFrom(this_03,from_20);
          break;
        case 0x12d:
          clear_Type(this);
          this->_oneof_case_[0] = 0x12d;
          this_26 = (SupportVectorRegressor *)operator_new(0x38);
          SupportVectorRegressor::SupportVectorRegressor(this_26);
          (this->Type_).supportvectorregressor_ = this_26;
          if (from->_oneof_case_[0] == 0x12d) {
            from_21 = (from->Type_).supportvectorregressor_;
          }
          else {
            from_21 = SupportVectorRegressor::default_instance();
          }
          SupportVectorRegressor::MergeFrom(this_26,from_21);
          break;
        case 0x12e:
          clear_Type(this);
          this->_oneof_case_[0] = 0x12e;
          this_21 = (TreeEnsembleRegressor *)operator_new(0x20);
          TreeEnsembleRegressor::TreeEnsembleRegressor(this_21);
          (this->Type_).treeensembleregressor_ = this_21;
          if (from->_oneof_case_[0] == 0x12e) {
            from_16 = (from->Type_).treeensembleregressor_;
          }
          else {
            from_16 = TreeEnsembleRegressor::default_instance();
          }
          TreeEnsembleRegressor::MergeFrom(this_21,from_16);
          break;
        case 0x12f:
          clear_Type(this);
          this->_oneof_case_[0] = 0x12f;
          this_23 = (NeuralNetworkRegressor *)operator_new(0x58);
          NeuralNetworkRegressor::NeuralNetworkRegressor(this_23);
          (this->Type_).neuralnetworkregressor_ = this_23;
          if (from->_oneof_case_[0] == 0x12f) {
            from_18 = (from->Type_).neuralnetworkregressor_;
          }
          else {
            from_18 = NeuralNetworkRegressor::default_instance();
          }
          NeuralNetworkRegressor::MergeFrom(this_23,from_18);
          break;
        case 0x130:
          clear_Type(this);
          this->_oneof_case_[0] = 0x130;
          this_17 = (BayesianProbitRegressor *)operator_new(0x78);
          BayesianProbitRegressor::BayesianProbitRegressor(this_17);
          (this->Type_).bayesianprobitregressor_ = this_17;
          if (from->_oneof_case_[0] == 0x130) {
            from_10 = (from->Type_).bayesianprobitregressor_;
          }
          else {
            from_10 = BayesianProbitRegressor::default_instance();
          }
          BayesianProbitRegressor::MergeFrom(this_17,from_10);
        }
      }
    }
    else if ((int)uVar1 < 500) {
      switch(uVar1) {
      case 400:
        clear_Type(this);
        this->_oneof_case_[0] = 400;
        this_01 = (GLMClassifier *)operator_new(0x58);
        GLMClassifier::GLMClassifier(this_01);
        (this->Type_).glmclassifier_ = this_01;
        if (from->_oneof_case_[0] == 400) {
          from_22 = (from->Type_).glmclassifier_;
        }
        else {
          from_22 = GLMClassifier::default_instance();
        }
        GLMClassifier::MergeFrom(this_01,from_22);
        break;
      case 0x191:
        clear_Type(this);
        this->_oneof_case_[0] = 0x191;
        this_28 = (SupportVectorClassifier *)operator_new(0xb0);
        SupportVectorClassifier::SupportVectorClassifier(this_28);
        (this->Type_).supportvectorclassifier_ = this_28;
        if (from->_oneof_case_[0] == 0x191) {
          from_23 = (from->Type_).supportvectorclassifier_;
        }
        else {
          from_23 = SupportVectorClassifier::default_instance();
        }
        SupportVectorClassifier::MergeFrom(this_28,from_23);
        break;
      case 0x192:
        clear_Type(this);
        this->_oneof_case_[0] = 0x192;
        this_22 = (TreeEnsembleClassifier *)operator_new(0x30);
        TreeEnsembleClassifier::TreeEnsembleClassifier(this_22);
        (this->Type_).treeensembleclassifier_ = this_22;
        if (from->_oneof_case_[0] == 0x192) {
          from_17 = (from->Type_).treeensembleclassifier_;
        }
        else {
          from_17 = TreeEnsembleClassifier::default_instance();
        }
        TreeEnsembleClassifier::MergeFrom(this_22,from_17);
        break;
      case 0x193:
        clear_Type(this);
        this->_oneof_case_[0] = 0x193;
        this_25 = (NeuralNetworkClassifier *)operator_new(0x68);
        NeuralNetworkClassifier::NeuralNetworkClassifier(this_25);
        (this->Type_).neuralnetworkclassifier_ = this_25;
        if (from->_oneof_case_[0] == 0x193) {
          from_19 = (from->Type_).neuralnetworkclassifier_;
        }
        else {
          from_19 = NeuralNetworkClassifier::default_instance();
        }
        NeuralNetworkClassifier::MergeFrom(this_25,from_19);
        break;
      case 0x194:
        clear_Type(this);
        this->_oneof_case_[0] = 0x194;
        this_18 = (KNearestNeighborsClassifier *)operator_new(0x48);
        KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_18);
        (this->Type_).knearestneighborsclassifier_ = this_18;
        if (from->_oneof_case_[0] == 0x194) {
          from_11 = (from->Type_).knearestneighborsclassifier_;
        }
        else {
          from_11 = KNearestNeighborsClassifier::default_instance();
        }
        KNearestNeighborsClassifier::MergeFrom(this_18,from_11);
      }
    }
    else if ((int)uVar1 < 0x22b) {
      if (uVar1 == 500) {
        clear_Type(this);
        this->_oneof_case_[0] = 500;
        this_19 = (NeuralNetwork *)operator_new(0x58);
        NeuralNetwork::NeuralNetwork(this_19);
        (this->Type_).neuralnetwork_ = this_19;
        if (from->_oneof_case_[0] == 500) {
          from_12 = (from->Type_).neuralnetwork_;
        }
        else {
          from_12 = NeuralNetwork::default_instance();
        }
        NeuralNetwork::MergeFrom(this_19,from_12);
      }
      else if (uVar1 == 0x1f5) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x1f5;
        this_05 = (ItemSimilarityRecommender *)operator_new(0x70);
        ItemSimilarityRecommender::ItemSimilarityRecommender(this_05);
        (this->Type_).itemsimilarityrecommender_ = this_05;
        if (from->_oneof_case_[0] == 0x1f5) {
          from_14 = (from->Type_).itemsimilarityrecommender_;
        }
        else {
          from_14 = ItemSimilarityRecommender::default_instance();
        }
        ItemSimilarityRecommender::MergeFrom(this_05,from_14);
      }
    }
    else if (uVar1 == 0x22b) {
      clear_Type(this);
      this->_oneof_case_[0] = 0x22b;
      this_20 = (CustomModel *)operator_new(0x48);
      CustomModel::CustomModel(this_20);
      (this->Type_).custommodel_ = this_20;
      if (from->_oneof_case_[0] == 0x22b) {
        from_13 = (from->Type_).custommodel_;
      }
      else {
        from_13 = CustomModel::default_instance();
      }
      CustomModel::MergeFrom(this_20,from_13);
    }
    else if (uVar1 == 0x22c) {
      clear_Type(this);
      this->_oneof_case_[0] = 0x22c;
      this_08 = (LinkedModel *)operator_new(0x20);
      LinkedModel::LinkedModel(this_08);
      (this->Type_).linkedmodel_ = this_08;
      if (from->_oneof_case_[0] == 0x22c) {
        from_15 = (from->Type_).linkedmodel_;
      }
      else {
        from_15 = LinkedModel::default_instance();
      }
      LinkedModel::MergeFrom(this_08,from_15);
    }
  }
  else if ((int)uVar1 < 900) {
    switch(uVar1) {
    case 600:
      clear_Type(this);
      this->_oneof_case_[0] = 600;
      this_02 = (OneHotEncoder *)operator_new(0x28);
      OneHotEncoder::OneHotEncoder(this_02);
      (this->Type_).onehotencoder_ = this_02;
      if (from->_oneof_case_[0] == 600) {
        from_07 = (from->Type_).onehotencoder_;
      }
      else {
        from_07 = OneHotEncoder::default_instance();
      }
      OneHotEncoder::MergeFrom(this_02,from_07);
      break;
    case 0x259:
      clear_Type(this);
      this->_oneof_case_[0] = 0x259;
      this_13 = (Imputer *)operator_new(0x30);
      Imputer::Imputer(this_13);
      (this->Type_).imputer_ = this_13;
      if (from->_oneof_case_[0] == 0x259) {
        from_05 = (from->Type_).imputer_;
      }
      else {
        from_05 = Imputer::default_instance();
      }
      Imputer::MergeFrom(this_13,from_05);
      break;
    case 0x25a:
      clear_Type(this);
      this->_oneof_case_[0] = 0x25a;
      this_14 = (FeatureVectorizer *)operator_new(0x30);
      FeatureVectorizer::FeatureVectorizer(this_14);
      (this->Type_).featurevectorizer_ = this_14;
      if (from->_oneof_case_[0] == 0x25a) {
        from_06 = (from->Type_).featurevectorizer_;
      }
      else {
        from_06 = FeatureVectorizer::default_instance();
      }
      FeatureVectorizer::MergeFrom(this_14,from_06);
      break;
    case 0x25b:
      clear_Type(this);
      this->_oneof_case_[0] = 0x25b;
      this_15 = (DictVectorizer *)operator_new(0x20);
      DictVectorizer::DictVectorizer(this_15);
      (this->Type_).dictvectorizer_ = this_15;
      if (from->_oneof_case_[0] == 0x25b) {
        from_08 = (from->Type_).dictvectorizer_;
      }
      else {
        from_08 = DictVectorizer::default_instance();
      }
      DictVectorizer::MergeFrom(this_15,from_08);
      break;
    case 0x25c:
      clear_Type(this);
      this->_oneof_case_[0] = 0x25c;
      this_12 = (Scaler *)operator_new(0x40);
      Scaler::Scaler(this_12);
      (this->Type_).scaler_ = this_12;
      if (from->_oneof_case_[0] == 0x25c) {
        from_04 = (from->Type_).scaler_;
      }
      else {
        from_04 = Scaler::default_instance();
      }
      Scaler::MergeFrom(this_12,from_04);
      break;
    case 0x25e:
      clear_Type(this);
      this->_oneof_case_[0] = 0x25e;
      this_11 = (CategoricalMapping *)operator_new(0x30);
      CategoricalMapping::CategoricalMapping(this_11);
      (this->Type_).categoricalmapping_ = this_11;
      if (from->_oneof_case_[0] == 0x25e) {
        from_03 = (from->Type_).categoricalmapping_;
      }
      else {
        from_03 = CategoricalMapping::default_instance();
      }
      CategoricalMapping::MergeFrom(this_11,from_03);
      break;
    case 0x25f:
      clear_Type(this);
      this->_oneof_case_[0] = 0x25f;
      this_16 = (Normalizer *)operator_new(0x18);
      Normalizer::Normalizer(this_16);
      (this->Type_).normalizer_ = this_16;
      if (from->_oneof_case_[0] == 0x25f) {
        from_09 = (from->Type_).normalizer_;
      }
      else {
        from_09 = Normalizer::default_instance();
      }
      Normalizer::MergeFrom(this_16,from_09);
      break;
    case 0x261:
      clear_Type(this);
      this->_oneof_case_[0] = 0x261;
      this_10 = (ArrayFeatureExtractor *)operator_new(0x28);
      ArrayFeatureExtractor::ArrayFeatureExtractor(this_10);
      (this->Type_).arrayfeatureextractor_ = this_10;
      if (from->_oneof_case_[0] == 0x261) {
        from_02 = (from->Type_).arrayfeatureextractor_;
      }
      else {
        from_02 = ArrayFeatureExtractor::default_instance();
      }
      ArrayFeatureExtractor::MergeFrom(this_10,from_02);
      break;
    case 0x262:
      clear_Type(this);
      this->_oneof_case_[0] = 0x262;
      this_09 = (NonMaximumSuppression *)operator_new(0x70);
      NonMaximumSuppression::NonMaximumSuppression(this_09);
      (this->Type_).nonmaximumsuppression_ = this_09;
      if (from->_oneof_case_[0] == 0x262) {
        from_01 = (from->Type_).nonmaximumsuppression_;
      }
      else {
        from_01 = NonMaximumSuppression::default_instance();
      }
      NonMaximumSuppression::MergeFrom(this_09,from_01);
    }
  }
  else {
    switch(uVar1) {
    case 2000:
      clear_Type(this);
      this->_oneof_case_[0] = 2000;
      this_04 = (TextClassifier *)operator_new(0x38);
      CoreMLModels::TextClassifier::TextClassifier(this_04);
      (this->Type_).textclassifier_ = this_04;
      if (from->_oneof_case_[0] == 2000) {
        from_28 = (from->Type_).textclassifier_;
      }
      else {
        from_28 = CoreMLModels::TextClassifier::default_instance();
      }
      CoreMLModels::TextClassifier::MergeFrom(this_04,from_28);
      break;
    case 0x7d1:
      clear_Type(this);
      this->_oneof_case_[0] = 0x7d1;
      this_33 = (WordTagger *)operator_new(0x58);
      CoreMLModels::WordTagger::WordTagger(this_33);
      (this->Type_).wordtagger_ = this_33;
      if (from->_oneof_case_[0] == 0x7d1) {
        from_29 = (from->Type_).wordtagger_;
      }
      else {
        from_29 = CoreMLModels::WordTagger::default_instance();
      }
      CoreMLModels::WordTagger::MergeFrom(this_33,from_29);
      break;
    case 0x7d2:
      clear_Type(this);
      this->_oneof_case_[0] = 0x7d2;
      this_31 = (VisionFeaturePrint *)operator_new(0x20);
      CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_31);
      (this->Type_).visionfeatureprint_ = this_31;
      if (from->_oneof_case_[0] == 0x7d2) {
        from_26 = (from->Type_).visionfeatureprint_;
      }
      else {
        from_26 = CoreMLModels::VisionFeaturePrint::default_instance();
      }
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_31,from_26);
      break;
    case 0x7d3:
      clear_Type(this);
      this->_oneof_case_[0] = 0x7d3;
      this_32 = (SoundAnalysisPreprocessing *)operator_new(0x20);
      CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_32);
      (this->Type_).soundanalysispreprocessing_ = this_32;
      if (from->_oneof_case_[0] == 0x7d3) {
        from_27 = (from->Type_).soundanalysispreprocessing_;
      }
      else {
        from_27 = CoreMLModels::SoundAnalysisPreprocessing::default_instance();
      }
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_32,from_27);
      break;
    case 0x7d4:
      clear_Type(this);
      this->_oneof_case_[0] = 0x7d4;
      this_30 = (Gazetteer *)operator_new(0x38);
      CoreMLModels::Gazetteer::Gazetteer(this_30);
      (this->Type_).gazetteer_ = this_30;
      if (from->_oneof_case_[0] == 0x7d4) {
        from_25 = (from->Type_).gazetteer_;
      }
      else {
        from_25 = CoreMLModels::Gazetteer::default_instance();
      }
      CoreMLModels::Gazetteer::MergeFrom(this_30,from_25);
      break;
    case 0x7d5:
      clear_Type(this);
      this->_oneof_case_[0] = 0x7d5;
      this_34 = (WordEmbedding *)operator_new(0x28);
      CoreMLModels::WordEmbedding::WordEmbedding(this_34);
      (this->Type_).wordembedding_ = this_34;
      if (from->_oneof_case_[0] == 0x7d5) {
        from_30 = (from->Type_).wordembedding_;
      }
      else {
        from_30 = CoreMLModels::WordEmbedding::default_instance();
      }
      CoreMLModels::WordEmbedding::MergeFrom(this_34,from_30);
      break;
    default:
      if (uVar1 == 900) {
        clear_Type(this);
        this->_oneof_case_[0] = 900;
        this_29 = (Identity *)operator_new(0x18);
        Identity::Identity(this_29);
        (this->Type_).identity_ = this_29;
        if (from->_oneof_case_[0] == 900) {
          from_24 = (from->Type_).identity_;
        }
        else {
          from_24 = Identity::default_instance();
        }
        Identity::MergeFrom(this_29,from_24);
      }
      else if (uVar1 == 3000) {
        clear_Type(this);
        this->_oneof_case_[0] = 3000;
        this_07 = (SerializedModel *)operator_new(0x28);
        SerializedModel::SerializedModel(this_07);
        (this->Type_).serializedmodel_ = this_07;
        if (from->_oneof_case_[0] == 3000) {
          from_34 = (from->Type_).serializedmodel_;
        }
        else {
          protobuf_Model_2eproto::InitDefaults();
          from_34 = (SerializedModel *)&_SerializedModel_default_instance_;
        }
        SerializedModel::MergeFrom(this_07,from_34);
      }
    }
  }
  return;
}

Assistant:

Model::Model(const Model& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_description()) {
    description_ = new ::CoreML::Specification::ModelDescription(*from.description_);
  } else {
    description_ = NULL;
  }
  ::memcpy(&specificationversion_, &from.specificationversion_,
    reinterpret_cast<char*>(&isupdatable_) -
    reinterpret_cast<char*>(&specificationversion_) + sizeof(isupdatable_));
  clear_has_Type();
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Model)
}